

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_texture_view
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_texture_view *out_texture_view)

{
  int iVar1;
  cgltf_size cVar2;
  int iVar3;
  int iVar4;
  cgltf_extension *pcVar5;
  cgltf_float cVar6;
  int local_48;
  int k;
  int extensions_size;
  int j;
  int size;
  cgltf_texture_view *out_texture_view_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  cgltf_options *options_local;
  
  if (tokens[i].type == JSMN_OBJECT) {
    out_texture_view->scale = 1.0;
    cgltf_fill_float_array((out_texture_view->transform).scale,2,1.0);
    iVar1 = tokens[i].size;
    json_chunk_local._4_4_ = i + 1;
    for (k = 0; k < iVar1; k = k + 1) {
      if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
         (tokens[json_chunk_local._4_4_].size == 0)) {
        return -1;
      }
      iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"index");
      if (iVar3 == 0) {
        iVar3 = cgltf_json_to_int(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
        out_texture_view->texture = (cgltf_texture *)((long)iVar3 + 1);
        json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
      }
      else {
        iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"texCoord");
        if (iVar3 == 0) {
          iVar3 = cgltf_json_to_int(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
          out_texture_view->texcoord = iVar3;
          json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
        }
        else {
          iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"scale");
          if (iVar3 == 0) {
            cVar6 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
            out_texture_view->scale = cVar6;
            json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
          }
          else {
            iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"strength");
            if (iVar3 == 0) {
              cVar6 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
              out_texture_view->scale = cVar6;
              json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
            }
            else {
              iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"extras");
              if (iVar3 == 0) {
                json_chunk_local._4_4_ =
                     cgltf_parse_json_extras
                               (tokens,json_chunk_local._4_4_ + 1,json_chunk,
                                &out_texture_view->extras);
              }
              else {
                iVar3 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"extensions");
                if (iVar3 == 0) {
                  if (tokens[json_chunk_local._4_4_ + 1].type != JSMN_OBJECT) {
                    return -1;
                  }
                  if (out_texture_view->extensions != (cgltf_extension *)0x0) {
                    return -1;
                  }
                  iVar3 = tokens[json_chunk_local._4_4_ + 1].size;
                  out_texture_view->extensions_count = 0;
                  pcVar5 = (cgltf_extension *)cgltf_calloc(options,0x10,(long)iVar3);
                  out_texture_view->extensions = pcVar5;
                  if (out_texture_view->extensions == (cgltf_extension *)0x0) {
                    return -2;
                  }
                  json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
                  for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
                    if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
                       (tokens[json_chunk_local._4_4_].size == 0)) {
                      return -1;
                    }
                    iVar4 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,
                                              "KHR_texture_transform");
                    if (iVar4 == 0) {
                      out_texture_view->has_transform = 1;
                      json_chunk_local._4_4_ =
                           cgltf_parse_json_texture_transform
                                     (tokens,json_chunk_local._4_4_ + 1,json_chunk,
                                      &out_texture_view->transform);
                    }
                    else {
                      cVar2 = out_texture_view->extensions_count;
                      out_texture_view->extensions_count = cVar2 + 1;
                      json_chunk_local._4_4_ =
                           cgltf_parse_json_unprocessed_extension
                                     (options,tokens,json_chunk_local._4_4_,json_chunk,
                                      out_texture_view->extensions + cVar2);
                    }
                    if (json_chunk_local._4_4_ < 0) {
                      return json_chunk_local._4_4_;
                    }
                  }
                }
                else {
                  json_chunk_local._4_4_ = cgltf_skip_json(tokens,json_chunk_local._4_4_ + 1);
                }
              }
            }
          }
        }
      }
      if (json_chunk_local._4_4_ < 0) {
        return json_chunk_local._4_4_;
      }
    }
    options_local._4_4_ = json_chunk_local._4_4_;
  }
  else {
    options_local._4_4_ = -1;
  }
  return options_local._4_4_;
}

Assistant:

static int cgltf_parse_json_texture_view(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

	out_texture_view->scale = 1.0f;
	cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

	int size = tokens[i].size;
	++i;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
		{
			++i;
			out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
		{
			++i;
			out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0) 
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
		{
			i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
		{
			++i;

			CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
			if(out_texture_view->extensions)
			{
				return CGLTF_ERROR_JSON;
			}

			int extensions_size = tokens[i].size;
			out_texture_view->extensions_count = 0;
			out_texture_view->extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

			if (!out_texture_view->extensions)
			{
				return CGLTF_ERROR_NOMEM;
			}

			++i;

			for (int k = 0; k < extensions_size; ++k)
			{
				CGLTF_CHECK_KEY(tokens[i]);

				if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
				{
					out_texture_view->has_transform = 1;
					i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
				}
				else
				{
					i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, &(out_texture_view->extensions[out_texture_view->extensions_count++]));
				}

				if (i < 0)
				{
					return i;
				}
			}
		}
		else
		{
			i = cgltf_skip_json(tokens, i + 1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}